

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdarg.c
# Opt level: O3

int main(void)

{
  int x;
  unkbyte10 Var1;
  undefined4 local_28;
  unkbyte10 local_24;
  unkbyte10 local_18;
  
  local_28 = 0x7fffffff;
  local_24 = _DAT_00104010;
  local_18 = _DAT_00104010;
  test(0);
  test(1,0x7fffffff,0);
  test(2,0x7fffffffffffffff,3,0x7fffffffffffffff,0);
  Var1 = local_24;
  test(4,0x7fefffffffffffff,5,0);
  test(6,&local_28,7,&local_18,8,dummy,(unkuint10)(uint6)((unkuint10)Var1 >> 0x20) << 0x20);
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    int x = INT_MAX;
    long double d = LDBL_MAX;
    test( TAG_END );
    test( TAG_INT, INT_MAX, TAG_END );
    test( TAG_LONG, LONG_MAX, TAG_LLONG, LLONG_MAX, TAG_END );
    test( TAG_DBL, DBL_MAX, TAG_LDBL, LDBL_MAX, TAG_END );
    test( TAG_INTPTR, &x, TAG_LDBLPTR, &d, TAG_FUNCPTR, dummy, TAG_END );
    return TEST_RESULTS;
}